

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::RunContext::handleUnfinishedSections(RunContext *this)

{
  bool bVar1;
  pointer pUVar2;
  long *in_RDI;
  const_reverse_iterator itEnd;
  const_reverse_iterator it;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_Catch::RunContext::UnfinishedSections_*,_std::vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>_>_>
  *in_stack_ffffffffffffffb8;
  pointer in_stack_ffffffffffffffc0;
  vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
  *in_stack_ffffffffffffffc8;
  Counts *pCVar3;
  
  std::
  vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
  ::rbegin(in_stack_ffffffffffffffc8);
  std::
  reverse_iterator<__gnu_cxx::__normal_iterator<Catch::RunContext::UnfinishedSections_const*,std::vector<Catch::RunContext::UnfinishedSections,std::allocator<Catch::RunContext::UnfinishedSections>>>>
  ::
  reverse_iterator<__gnu_cxx::__normal_iterator<Catch::RunContext::UnfinishedSections*,std::vector<Catch::RunContext::UnfinishedSections,std::allocator<Catch::RunContext::UnfinishedSections>>>>
            ((reverse_iterator<__gnu_cxx::__normal_iterator<const_Catch::RunContext::UnfinishedSections_*,_std::vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>_>_>
              *)in_stack_ffffffffffffffc0,
             (reverse_iterator<__gnu_cxx::__normal_iterator<Catch::RunContext::UnfinishedSections_*,_std::vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>_>_>
              *)in_stack_ffffffffffffffb8);
  std::
  vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
  ::rend(in_stack_ffffffffffffffc8);
  std::
  reverse_iterator<__gnu_cxx::__normal_iterator<Catch::RunContext::UnfinishedSections_const*,std::vector<Catch::RunContext::UnfinishedSections,std::allocator<Catch::RunContext::UnfinishedSections>>>>
  ::
  reverse_iterator<__gnu_cxx::__normal_iterator<Catch::RunContext::UnfinishedSections*,std::vector<Catch::RunContext::UnfinishedSections,std::allocator<Catch::RunContext::UnfinishedSections>>>>
            ((reverse_iterator<__gnu_cxx::__normal_iterator<const_Catch::RunContext::UnfinishedSections_*,_std::vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>_>_>
              *)in_stack_ffffffffffffffc0,
             (reverse_iterator<__gnu_cxx::__normal_iterator<Catch::RunContext::UnfinishedSections_*,_std::vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>_>_>
              *)in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<const_Catch::RunContext::UnfinishedSections_*,_std::vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>_>_>
                             *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    in_stack_ffffffffffffffc0 =
         std::
         reverse_iterator<__gnu_cxx::__normal_iterator<const_Catch::RunContext::UnfinishedSections_*,_std::vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>_>_>
         ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_Catch::RunContext::UnfinishedSections_*,_std::vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>_>_>
                       *)in_stack_ffffffffffffffc0);
    pUVar2 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<const_Catch::RunContext::UnfinishedSections_*,_std::vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>_>_>
             ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_Catch::RunContext::UnfinishedSections_*,_std::vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>_>_>
                           *)in_stack_ffffffffffffffc0);
    pCVar3 = &pUVar2->prevAssertions;
    pUVar2 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<const_Catch::RunContext::UnfinishedSections_*,_std::vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>_>_>
             ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_Catch::RunContext::UnfinishedSections_*,_std::vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>_>_>
                           *)in_stack_ffffffffffffffc0);
    (**(code **)(*in_RDI + 0x20))(pUVar2->durationInSeconds,in_RDI,in_stack_ffffffffffffffc0,pCVar3)
    ;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_Catch::RunContext::UnfinishedSections_*,_std::vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_Catch::RunContext::UnfinishedSections_*,_std::vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>_>_>
                  *)in_stack_ffffffffffffffc0);
  }
  std::
  vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
  ::clear((vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
           *)0x260533);
  return;
}

Assistant:

void handleUnfinishedSections() {
            // If sections ended prematurely due to an exception we stored their
            // infos here so we can tear them down outside the unwind process.
            for( std::vector<UnfinishedSections>::const_reverse_iterator it = m_unfinishedSections.rbegin(),
                        itEnd = m_unfinishedSections.rend();
                    it != itEnd;
                    ++it )
                sectionEnded( it->info, it->prevAssertions, it->durationInSeconds );
            m_unfinishedSections.clear();
        }